

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *in_RCX;
  int sock;
  int sock_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  int timeo;
  nn_thread thread3;
  nn_thread thread2;
  nn_thread thread1;
  undefined4 local_464;
  nn_thread local_460;
  nn_thread local_448;
  nn_thread local_430;
  undefined1 local_418 [1024];
  
  nn_thread_init(&local_430,device1,(void *)0x0);
  iVar1 = test_socket_impl((char *)0x76,1,0x10,(int)in_RCX);
  test_connect_impl((char *)0x77,iVar1,0x102175,in_RCX);
  iVar2 = test_socket_impl((char *)0x78,1,0x10,(int)in_RCX);
  test_connect_impl((char *)0x79,iVar2,0x102180,in_RCX);
  test_send_impl((char *)0x7c,iVar1,0x102222,in_RCX);
  test_recv_impl((char *)0x7d,iVar2,0x102222,in_RCX);
  test_send_impl((char *)0x7e,iVar2,0x102222,in_RCX);
  test_recv_impl((char *)0x7f,iVar1,0x102222,in_RCX);
  test_close_impl((char *)0x82,iVar2,sock);
  test_close_impl((char *)0x83,iVar1,sock_00);
  nn_thread_init(&local_448,device2,(void *)0x0);
  iVar1 = test_socket_impl((char *)0x8b,1,0x50,(int)in_RCX);
  test_connect_impl((char *)0x8c,iVar1,0x1021e2,in_RCX);
  iVar2 = test_socket_impl((char *)0x8d,1,0x51,(int)in_RCX);
  test_connect_impl((char *)0x8e,iVar2,0x1021ed,in_RCX);
  test_send_impl((char *)0x91,iVar1,0x102226,in_RCX);
  test_recv_impl((char *)0x92,iVar2,0x102226,in_RCX);
  test_close_impl((char *)0x95,iVar2,sock_01);
  test_close_impl((char *)0x96,iVar1,sock_02);
  nn_thread_init(&local_460,device3,(void *)0x0);
  iVar1 = test_socket_impl((char *)0x9e,1,0x70,(int)in_RCX);
  test_connect_impl((char *)0x9f,iVar1,0x102217,in_RCX);
  iVar2 = test_socket_impl((char *)0xa0,1,0x70,(int)in_RCX);
  test_connect_impl((char *)0xa1,iVar2,0x102217,in_RCX);
  nn_sleep(100);
  test_send_impl((char *)0xa7,iVar1,0x10222a,in_RCX);
  test_recv_impl((char *)0xa8,iVar2,0x10222a,in_RCX);
  local_464 = 100;
  iVar3 = nn_setsockopt(iVar1,0,5,&local_464,4);
  if (iVar3 < 0) {
    main_cold_3();
  }
  else {
    iVar3 = nn_recv(iVar1,local_418,0x400,0);
    if (iVar3 < 0) {
      piVar4 = __errno_location();
      if (*piVar4 == 0x6e) {
        test_close_impl((char *)0xb2,iVar2,sock_03);
        test_close_impl((char *)0xb3,iVar1,sock_04);
        nn_term();
        nn_thread_term(&local_430);
        nn_thread_term(&local_448);
        nn_thread_term(&local_460);
        return 0;
      }
      goto LAB_00101d97;
    }
  }
  main_cold_1();
LAB_00101d97:
  main_cold_2();
}

Assistant:

int main ()
{
    int enda;
    int endb;
    int endc;
    int endd;
    int ende1;
    int ende2;
    struct nn_thread thread1;
    struct nn_thread thread2;
    struct nn_thread thread3;
    int timeo;

    /*  Test the bi-directional device. */

    /*  Start the device. */
    nn_thread_init (&thread1, device1, NULL);

    /*  Create two sockets to connect to the device. */
    enda = test_socket (AF_SP, NN_PAIR);
    test_connect (enda, SOCKET_ADDRESS_A);
    endb = test_socket (AF_SP, NN_PAIR);
    test_connect (endb, SOCKET_ADDRESS_B);

    /*  Pass a pair of messages between endpoints. */
    test_send (enda, "ABC");
    test_recv (endb, "ABC");
    test_send (endb, "ABC");
    test_recv (enda, "ABC");

    /*  Clean up. */
    test_close (endb);
    test_close (enda);

    /*  Test the uni-directional device. */

    /*  Start the device. */
    nn_thread_init (&thread2, device2, NULL);

    /*  Create two sockets to connect to the device. */
    endc = test_socket (AF_SP, NN_PUSH);
    test_connect (endc, SOCKET_ADDRESS_C);
    endd = test_socket (AF_SP, NN_PULL);
    test_connect (endd, SOCKET_ADDRESS_D);

    /*  Pass a message between endpoints. */
    test_send (endc, "XYZ");
    test_recv (endd, "XYZ");

    /*  Clean up. */
    test_close (endd);
    test_close (endc);

    /*  Test the loopback device. */

    /*  Start the device. */
    nn_thread_init (&thread3, device3, NULL);

    /*  Create two sockets to connect to the device. */
    ende1 = test_socket (AF_SP, NN_BUS);
    test_connect (ende1, SOCKET_ADDRESS_E);
    ende2 = test_socket (AF_SP, NN_BUS);
    test_connect (ende2, SOCKET_ADDRESS_E);

    /*  BUS is unreliable so wait a bit for connections to be established. */
    nn_sleep (100);

    /*  Pass a message to the bus. */
    test_send (ende1, "KLM");
    test_recv (ende2, "KLM");

    /*  Make sure that the message doesn't arrive at the socket it was
        originally sent to. */
    timeo = 100;
    test_setsockopt (ende1, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    test_drop (ende1, ETIMEDOUT);

    /*  Clean up. */
    test_close (ende2);
    test_close (ende1);

    /*  Shut down the devices. */
    nn_term ();
    nn_thread_term (&thread1);
    nn_thread_term (&thread2);
    nn_thread_term (&thread3);

    return 0;
}